

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::updateArea(btSoftBody *this,bool averageArea)

{
  btScalar bVar1;
  int iVar2;
  Face *pFVar3;
  long lVar4;
  Node *pNVar5;
  Node *pNVar6;
  undefined1 auVar7 [16];
  long lVar8;
  int *__s;
  btScalar *pbVar9;
  Node **ppNVar10;
  int j_1;
  long lVar11;
  int j;
  long lVar12;
  size_t size;
  long lVar13;
  float fVar14;
  uint uVar15;
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  int iVar29;
  btAlignedObjectArray<int> counts;
  btAlignedObjectArray<int> bStack_48;
  
  lVar8 = (long)(this->m_faces).m_size;
  if (0 < lVar8) {
    lVar13 = 0;
    do {
      pFVar3 = (this->m_faces).m_data;
      lVar12 = *(long *)((long)pFVar3->m_n + lVar13);
      lVar11 = *(long *)((long)pFVar3->m_n + lVar13 + 8);
      lVar4 = *(long *)((long)pFVar3->m_n + lVar13 + 0x10);
      fVar19 = *(float *)(lVar11 + 0x10) - *(float *)(lVar12 + 0x10);
      fVar23 = *(float *)(lVar11 + 0x14) - *(float *)(lVar12 + 0x14);
      fVar20 = *(float *)(lVar11 + 0x18) - *(float *)(lVar12 + 0x18);
      fVar28 = *(float *)(lVar4 + 0x10) - *(float *)(lVar12 + 0x10);
      fVar14 = *(float *)(lVar4 + 0x14) - *(float *)(lVar12 + 0x14);
      fVar25 = *(float *)(lVar4 + 0x18) - *(float *)(lVar12 + 0x18);
      fVar24 = fVar23 * fVar25 - fVar14 * fVar20;
      fVar20 = fVar20 * fVar28 - fVar25 * fVar19;
      fVar14 = fVar14 * fVar19 - fVar28 * fVar23;
      fVar14 = fVar14 * fVar14 + fVar24 * fVar24 + fVar20 * fVar20;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      *(float *)((long)(&pFVar3->m_normal + 1) + lVar13) = fVar14;
      lVar13 = lVar13 + 0x48;
    } while (lVar8 * 0x48 != lVar13);
  }
  auVar7 = _DAT_001f5270;
  if (averageArea) {
    bStack_48.m_ownsMemory = true;
    bStack_48.m_data = (int *)0x0;
    bStack_48.m_size = 0;
    bStack_48.m_capacity = 0;
    iVar2 = (this->m_nodes).m_size;
    if ((-1 < (long)iVar2) && (iVar2 != 0)) {
      size = (long)iVar2 << 2;
      __s = (int *)btAlignedAllocInternal(size,0x10);
      if (0 < (long)bStack_48.m_size) {
        lVar8 = 0;
        do {
          __s[lVar8] = bStack_48.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (bStack_48.m_size != lVar8);
      }
      if ((bStack_48.m_data != (int *)0x0) && (bStack_48.m_ownsMemory == true)) {
        btAlignedFreeInternal(bStack_48.m_data);
      }
      bStack_48.m_ownsMemory = true;
      bStack_48.m_data = __s;
      bStack_48.m_capacity = iVar2;
      if (iVar2 != 0) {
        memset(__s,0,size);
      }
    }
    auVar7 = _DAT_001f5270;
    bStack_48.m_size = iVar2;
    iVar2 = (this->m_nodes).m_size;
    if (0 < (long)iVar2) {
      pNVar5 = (this->m_nodes).m_data;
      lVar8 = (long)iVar2 + -1;
      auVar16._8_4_ = (int)lVar8;
      auVar16._0_8_ = lVar8;
      auVar16._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar16 = auVar16 ^ _DAT_001f5270;
      auVar27 = _DAT_001f57f0;
      auVar21 = _DAT_001f55c0;
      do {
        auVar26 = auVar21 ^ auVar7;
        iVar18 = auVar16._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar18 && auVar16._0_4_ < auVar26._0_4_ ||
                    iVar18 < auVar26._4_4_) & 1)) {
          *(undefined4 *)((long)(&pNVar5->m_n + 1) + lVar8 + 4) = 0;
        }
        if ((auVar26._12_4_ != auVar16._12_4_ || auVar26._8_4_ <= auVar16._8_4_) &&
            auVar26._12_4_ <= auVar16._12_4_) {
          *(undefined4 *)((long)(&pNVar5[1].m_n + 1) + lVar8 + 4) = 0;
        }
        auVar26 = auVar27 ^ auVar7;
        iVar29 = auVar26._4_4_;
        if (iVar29 <= iVar18 && (iVar29 != iVar18 || auVar26._0_4_ <= auVar16._0_4_)) {
          *(undefined4 *)((long)(&pNVar5[2].m_n + 1) + lVar8 + 4) = 0;
          *(undefined4 *)((long)(&pNVar5[3].m_n + 1) + lVar8 + 4) = 0;
        }
        lVar13 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar13 + 4;
        lVar13 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 4;
        auVar27._8_8_ = lVar13 + 4;
        lVar8 = lVar8 + 0x1e0;
      } while ((ulong)(iVar2 + 3U >> 2) * 0x1e0 - lVar8 != 0);
    }
    lVar8 = (long)(this->m_faces).m_size;
    if (0 < lVar8) {
      pNVar5 = (this->m_nodes).m_data;
      pFVar3 = (this->m_faces).m_data;
      ppNVar10 = pFVar3->m_n;
      lVar13 = 0;
      uVar15 = (uint)DAT_001f53c0;
      do {
        bVar1 = pFVar3[lVar13].m_ra;
        lVar12 = 0;
        do {
          pNVar6 = ppNVar10[lVar12];
          bStack_48.m_data[(int)((ulong)((long)pNVar6 - (long)pNVar5) >> 3) * -0x11111111] =
               bStack_48.m_data[(int)((ulong)((long)pNVar6 - (long)pNVar5) >> 3) * -0x11111111] + 1;
          pNVar6->m_area = pNVar6->m_area + (float)((uint)bVar1 & uVar15);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar13 = lVar13 + 1;
        ppNVar10 = ppNVar10 + 9;
      } while (lVar13 != lVar8);
    }
    lVar8 = (long)(this->m_nodes).m_size;
    if (0 < lVar8) {
      pbVar9 = &((this->m_nodes).m_data)->m_area;
      lVar13 = 0;
      do {
        if (bStack_48.m_data[lVar13] < 1) {
          *pbVar9 = 0.0;
        }
        else {
          *pbVar9 = *pbVar9 / (float)bStack_48.m_data[lVar13];
        }
        lVar13 = lVar13 + 1;
        pbVar9 = pbVar9 + 0x1e;
      } while (lVar8 != lVar13);
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray(&bStack_48);
  }
  else {
    iVar2 = (this->m_nodes).m_size;
    lVar8 = (long)iVar2;
    if (0 < lVar8) {
      pNVar5 = (this->m_nodes).m_data;
      lVar13 = lVar8 + -1;
      auVar17._8_4_ = (int)lVar13;
      auVar17._0_8_ = lVar13;
      auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
      lVar13 = 0;
      auVar17 = auVar17 ^ _DAT_001f5270;
      auVar26 = _DAT_001f57f0;
      auVar22 = _DAT_001f55c0;
      do {
        auVar27 = auVar22 ^ auVar7;
        iVar18 = auVar17._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar18 && auVar17._0_4_ < auVar27._0_4_ ||
                    iVar18 < auVar27._4_4_) & 1)) {
          *(undefined4 *)((long)(&pNVar5->m_n + 1) + lVar13 + 4) = 0;
        }
        if ((auVar27._12_4_ != auVar17._12_4_ || auVar27._8_4_ <= auVar17._8_4_) &&
            auVar27._12_4_ <= auVar17._12_4_) {
          *(undefined4 *)((long)(&pNVar5[1].m_n + 1) + lVar13 + 4) = 0;
        }
        auVar27 = auVar26 ^ auVar7;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar18 && (iVar29 != iVar18 || auVar27._0_4_ <= auVar17._0_4_)) {
          *(undefined4 *)((long)(&pNVar5[2].m_n + 1) + lVar13 + 4) = 0;
          *(undefined4 *)((long)(&pNVar5[3].m_n + 1) + lVar13 + 4) = 0;
        }
        lVar12 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar12 + 4;
        lVar12 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 4;
        auVar26._8_8_ = lVar12 + 4;
        lVar13 = lVar13 + 0x1e0;
      } while ((ulong)(iVar2 + 3U >> 2) * 0x1e0 - lVar13 != 0);
    }
    lVar13 = (long)(this->m_faces).m_size;
    if (0 < lVar13) {
      pFVar3 = (this->m_faces).m_data;
      ppNVar10 = pFVar3->m_n;
      lVar12 = 0;
      do {
        fVar14 = pFVar3[lVar12].m_ra;
        lVar11 = 0;
        do {
          ppNVar10[lVar11]->m_area = ppNVar10[lVar11]->m_area + fVar14;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar12 = lVar12 + 1;
        ppNVar10 = ppNVar10 + 9;
      } while (lVar12 != lVar13);
    }
    if (0 < iVar2) {
      pNVar5 = (this->m_nodes).m_data;
      lVar13 = 0;
      do {
        *(float *)((long)(&pNVar5->m_n + 1) + lVar13 + 4) =
             *(float *)((long)(&pNVar5->m_n + 1) + lVar13 + 4) * 0.3333333;
        lVar13 = lVar13 + 0x78;
      } while (lVar8 * 0x78 - lVar13 != 0);
    }
  }
  return;
}

Assistant:

void				btSoftBody::updateArea(bool averageArea)
{
	int i,ni;

	/* Face area		*/ 
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		Face&		f=m_faces[i];
		f.m_ra	=	AreaOf(f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x);
	}
	
	/* Node area		*/ 

	if (averageArea)
	{
		btAlignedObjectArray<int>	counts;
		counts.resize(m_nodes.size(),0);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area	=	0;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];
			for(int j=0;j<3;++j)
			{
				const int index=(int)(f.m_n[j]-&m_nodes[0]);
				counts[index]++;
				f.m_n[j]->m_area+=btFabs(f.m_ra);
			}
		}
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			if(counts[i]>0)
				m_nodes[i].m_area/=(btScalar)counts[i];
			else
				m_nodes[i].m_area=0;
		}
	}
	else
	{
		// initialize node area as zero
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area=0;	
		}

		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];

			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_area += f.m_ra;
			}
		}

		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area *= 0.3333333f;
		}
	}
}